

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

int Nwk_ObjRef_rec(Nwk_Obj_t *pNode)

{
  int iVar1;
  Nwk_Obj_t *pNode_00;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  if ((*(uint *)&pNode->field_0x20 & 7) != 1) {
    iVar2 = pNode->nFanins;
    iVar3 = 1;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pNode_00 = pNode->pFanio[lVar4];
        if (pNode_00 == (Nwk_Obj_t *)0x0) {
          return iVar3;
        }
        iVar1 = pNode_00->nFanouts;
        pNode_00->nFanouts = iVar1 + 1;
        if (iVar1 == 0) {
          iVar2 = Nwk_ObjRef_rec(pNode_00);
          iVar3 = iVar3 + iVar2;
          iVar2 = pNode->nFanins;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
  }
  return iVar3;
}

Assistant:

int Nwk_ObjRef_rec( Nwk_Obj_t * pNode )
{
    Nwk_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Nwk_ObjIsCi(pNode) )
        return 0;
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin->nFanouts++ == 0 )
            Counter += Nwk_ObjRef_rec( pFanin );
    }
    return Counter;
}